

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

void Io_ReadWordTest(char *pFileName)

{
  Wlc_Ntk_t *p;
  Gia_Man_t *pInit;
  Wlc_Ntk_t *pNtk;
  Gia_Man_t *pNew;
  char *pFileName_local;
  
  p = Wlc_ReadVer(pFileName,(char *)0x0);
  if (p != (Wlc_Ntk_t *)0x0) {
    Wlc_WriteVer(p,"test.v",0,0);
    pInit = Wlc_NtkBitBlast(p,(Wlc_BstPar_t *)0x0);
    Gia_AigerWrite(pInit,"test.aig",0,0,0);
    Gia_ManStop(pInit);
    Wlc_NtkFree(p);
  }
  return;
}

Assistant:

void Io_ReadWordTest( char * pFileName )
{
    Gia_Man_t * pNew;
    Wlc_Ntk_t * pNtk = Wlc_ReadVer( pFileName, NULL );
    if ( pNtk == NULL )
        return;
    Wlc_WriteVer( pNtk, "test.v", 0, 0 );

    pNew = Wlc_NtkBitBlast( pNtk, NULL );
    Gia_AigerWrite( pNew, "test.aig", 0, 0, 0 );
    Gia_ManStop( pNew );

    Wlc_NtkFree( pNtk );
}